

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O2

void timer_tick(int cpu_cyc)

{
  byte bVar1;
  ushort uVar2;
  gbabus_t *pgVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pgVar3 = bus;
  for (uVar6 = 0; uVar6 < pgVar3->num_active_timers; uVar6 = uVar6 + 1) {
    bVar1 = pgVar3->TMACTIVE[uVar6];
    if ((pgVar3->TMSTART[bVar1] == true) && (uVar2 = pgVar3->TMCNT_H[bVar1].raw, (uVar2 & 4) == 0))
    {
      uVar4 = pgVar3->TMINT[bVar1].ticks + (short)cpu_cyc;
      pgVar3->TMINT[bVar1].ticks = uVar4;
      uVar5 = (ulong)((uVar2 & 3) << 2);
      timer_inc((uint)bVar1,(uint)(uVar4 >> (*(byte *)((long)timer_shift + uVar5) & 0x1f)),
                (uint)uVar4 & *(uint *)((long)timer_mask + uVar5));
      pgVar3 = bus;
    }
  }
  return;
}

Assistant:

void timer_tick(int cpu_cyc) {
    for (int i = 0; i < bus->num_active_timers; i++) {
        int n = bus->TMACTIVE[i];
        if (bus->TMSTART[n] && !bus->TMCNT_H[n].cascade) {
            bus->TMINT[n].ticks += cpu_cyc;
            word clocks = bus->TMINT[n].ticks >> timer_shift[bus->TMCNT_H[n].frequency];
            word remain = bus->TMINT[n].ticks & timer_mask[bus->TMCNT_H[n].frequency];
            timer_inc(n, clocks, remain);
        }
    }
}